

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattice.cpp
# Opt level: O0

void __thiscall
Lattice::addFace(Lattice *this,int vertexIndex,int faceIndex,vstr *directions,vint *signs)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  reference piVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  int *vertex;
  iterator __end1;
  iterator __begin1;
  vint *__range1;
  faceS face;
  int neighbourVertex;
  vint edges;
  vint vertices;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *__lhs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  value_type vVar9;
  size_type in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe78;
  vector<int,_std::allocator<int>_> *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  int *local_e8;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  int local_9c;
  undefined4 *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  vector<int,_std::allocator<int>_> local_7c;
  undefined4 local_54;
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  undefined4 local_10;
  undefined4 local_c;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1606ea);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1606f7);
  uVar2 = local_c;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,0);
  local_84 = (**(code **)(*in_RDI + 0x18))(in_RDI,uVar2,pvVar5,*pvVar6);
  uVar2 = local_c;
  local_88 = local_c;
  local_54 = local_84;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,1);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,1);
  local_80 = (**(code **)(*in_RDI + 0x18))(in_RDI,uVar2,pvVar5,*pvVar6);
  uVar2 = local_54;
  this_01 = &local_7c;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,2);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,2);
  uVar2 = (**(code **)(*in_RDI + 0x18))(in_RDI,uVar2,pvVar5,*pvVar6);
  *(undefined4 *)
   &(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start = uVar2;
  local_7c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._4_8_ =
       &local_88;
  local_7c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._12_8_ = 4;
  __l._M_array._4_4_ = in_stack_fffffffffffffdfc;
  __l._M_array._0_4_ = in_stack_fffffffffffffdf8;
  __l._M_len = in_stack_fffffffffffffe00;
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_fffffffffffffdf0,__l);
  uVar2 = local_c;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,0);
  uVar3 = (**(code **)(*in_RDI + 0x10))(in_RDI,uVar2,pvVar5,*pvVar6);
  local_a8 = uVar3;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,1);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,1);
  local_a4 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_c,pvVar5,*pvVar6);
  uVar2 = local_54;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,2);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,2);
  local_a0 = (**(code **)(*in_RDI + 0x10))(in_RDI,uVar2,pvVar5,*pvVar6);
  __last._M_current = &local_9c;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,2);
  vVar9 = *pvVar7;
  __first._M_current = (int *)0x3;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,3);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (local_20,(size_type)__first._M_current);
  iVar4 = (**(code **)(*in_RDI + 0x10))(in_RDI,vVar9,pvVar5,*pvVar6);
  *__last._M_current = iVar4;
  local_98 = &local_a8;
  local_90 = 4;
  __l_00._M_array._4_4_ = vVar9;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffdf8;
  __l_00._M_len = (size_type)pvVar5;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)__first._M_current,__l_00);
  faceS::faceS((faceS *)0x160b1e);
  __lhs = &local_38;
  local_d0 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffdd8);
  local_d8 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffdd8);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>(__first,__last)
  ;
  this_00 = &local_50;
  local_e0 = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
  local_e8 = (int *)std::vector<int,_std::allocator<int>_>::end(this_00);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>(__first,__last)
  ;
  std::vector<int,_std::allocator<int>_>::operator=
            (this_01,(vector<int,_std::allocator<int>_> *)CONCAT44(uVar3,in_stack_fffffffffffffe78))
  ;
  local_b0 = local_10;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)__first._M_current,(value_type *)__last._M_current);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)__first._M_current,(value_type *)__last._M_current);
  local_f0 = &local_38;
  local_f8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_00);
  std::vector<int,_std::allocator<int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)__lhs,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00)
    ;
    if (!bVar1) break;
    piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_f8);
    std::
    vector<std::vector<faceS,_std::allocator<faceS>_>,_std::allocator<std::vector<faceS,_std::allocator<faceS>_>_>_>
    ::operator[]((vector<std::vector<faceS,_std::allocator<faceS>_>,_std::allocator<std::vector<faceS,_std::allocator<faceS>_>_>_>
                  *)(in_RDI + 8),(long)*piVar8);
    std::vector<faceS,_std::allocator<faceS>_>::push_back
              ((vector<faceS,_std::allocator<faceS>_> *)__first._M_current,
               (value_type *)__last._M_current);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_f8);
  }
  faceS::~faceS((faceS *)0x160cef);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)__first._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)__first._M_current);
  return;
}

Assistant:

void Lattice::addFace(const int vertexIndex, const int faceIndex, const vstr &directions, const vint &signs)
{
    vint vertices;
    vint edges;
    int neighbourVertex = neighbour(vertexIndex, directions[0], signs[0]);
    vertices = {vertexIndex, neighbourVertex,
                neighbour(vertexIndex, directions[1], signs[1]),
                neighbour(neighbourVertex, directions[2], signs[2])};
    edges = {edgeIndex(vertexIndex, directions[0], signs[0]),
             edgeIndex(vertexIndex, directions[1], signs[1]),
             edgeIndex(neighbourVertex, directions[2], signs[2]),
             edgeIndex(vertices[2], directions[3], signs[3])};

    faceS face;
    std::sort(vertices.begin(), vertices.end());
    std::sort(edges.begin(), edges.end());
    face.vertices = vertices;
    face.faceIndex = faceIndex;
    faceToVertices.push_back(vertices);
    faceToEdges.push_back(edges);
    for (const auto &vertex : vertices)
    {
        vertexToFaces[vertex].push_back(face);
    }
}